

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O1

void * worker_thread_get_unique_keys(void *arg)

{
  int iVar1;
  long lVar2;
  void *extraout_RAX;
  undefined4 extraout_var;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  os_thread_t *thread_00;
  undefined1 local_148 [8];
  char vbuf [256];
  undefined8 local_40;
  unsigned_long_long key;
  size_t vsize;
  undefined8 uVar4;
  
  key = 0;
  if (*(int *)((long)arg + 0x1c) != 0) {
    uVar5 = 0;
    do {
      local_40 = ((ulong)*arg << 0x30) + uVar5;
      uVar4 = *(undefined8 *)((long)arg + 8);
      thread = (os_thread_t *)&stack0xffffffffffffffc0;
      lVar2 = vmemcache_get(uVar4,(os_thread_t *)&stack0xffffffffffffffc0,8,local_148,0x100,0,&key);
      uVar3 = (uint)uVar4;
      if (lVar2 == -1) {
        worker_thread_get_unique_keys_cold_1();
        pvVar7 = extraout_RAX;
        if (uVar3 != 0) {
          uVar6 = (ulong)uVar3;
          uVar5 = uVar6;
          pvVar7 = extraout_RDX;
          thread_00 = thread;
          do {
            os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                             *(_func_void_ptr_void_ptr **)((long)pvVar7 + 0x20),pvVar7);
            thread_00 = thread_00 + 1;
            pvVar7 = (void *)((long)pvVar7 + 0x28);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          do {
            iVar1 = os_thread_join(thread,(void **)0x0);
            pvVar7 = (void *)CONCAT44(extraout_var,iVar1);
            thread = thread + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        return pvVar7;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(uint *)((long)arg + 0x1c));
  }
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_get_unique_keys(void *arg)
{
	struct context *ctx = arg;
	unsigned long long key;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	for (unsigned i = 0; i < ctx->ops_count; i++) {
		key = ((unsigned long long)ctx->thread_number << 48) | i;
		if (vmemcache_get(ctx->cache, &key, sizeof(key),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}